

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O3

bool __thiscall ON_SleepLock::IsLocked(ON_SleepLock *this)

{
  __atomic_flag_data_type _Var1;
  
  LOCK();
  _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
  (this->m_lockedX).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    (this->m_lockedX).super___atomic_flag_base._M_i = false;
  }
  return _Var1 != false;
}

Assistant:

bool ON_SleepLock::IsLocked() const
{
  // ON_SleepLock::IsLocked() is not reliable. Do not use it. It will be deleted in the next SDK.
#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
  const bool b = m_lockedX.test_and_set(std::memory_order_acquire);
  if (false == b)
    m_lockedX.clear(std::memory_order_release);
  return b;
#else
  return 0 != m_locked;
#endif
}